

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigmund~.c
# Opt level: O2

void sigmund_hop(t_sigmund *x,t_floatarg f)

{
  uint uVar1;
  uint n;
  
  n = (uint)f;
  if ((int)n < 0) {
    pd_error((void *)0x0,"sigmund~: ignoring negative hopsize %d",(ulong)n);
    return;
  }
  x->x_hop = n;
  if (n != 0) {
    uVar1 = sigmund_ilog2(n);
    uVar1 = 1 << ((byte)uVar1 & 0x1f);
    if (uVar1 != n) {
      x->x_hop = uVar1;
      post("sigmund~: adjusting analysis size to %d points");
      return;
    }
  }
  return;
}

Assistant:

static void sigmund_hop(t_sigmund *x, t_floatarg f)
{
    int hop = f;
    if (hop < 0)
    {
        pd_error(0, "sigmund~: ignoring negative hopsize %d", hop);
        return;
    }
    x->x_hop = hop;
    if (0 == hop) return;
        /* check parameter ranges */
    if (x->x_hop != (1 << sigmund_ilog2(x->x_hop)))
        post("sigmund~: adjusting analysis size to %d points",
            (x->x_hop = (1 << sigmund_ilog2(x->x_hop))));
}